

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Parent *this_00;
  uint *puVar6;
  size_t sVar7;
  Leaf *this_01;
  bool local_121;
  bool local_101;
  bool local_f1;
  Fault local_e8;
  Fault f_6;
  Fault f_5;
  Fault f_4;
  Iterator local_c8;
  uint i_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  Range<unsigned_int> *__range3_1;
  uint n_1;
  Leaf *leaf;
  Fault f_3;
  Fault local_90;
  Fault f_2;
  Fault local_78;
  Fault f_1;
  Iterator local_68;
  uint i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  size_t total;
  uint n;
  Parent *parent;
  uint height_local;
  uint pos_local;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> *f_local;
  size_t size_local;
  BTreeImpl *this_local;
  ulong uStack_10;
  MaybeUint maxRow_local;
  
  this_local._4_4_ = maxRow.i;
  if (height == 0) {
    this_01 = (Leaf *)(this->tree + pos);
    uVar3 = Leaf::size(this_01);
    ___end3_1 = zeroTo<unsigned_int>(uVar3);
    i_1 = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3_1);
    local_c8 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end3_1);
    while (bVar2 = Range<unsigned_int>::Iterator::operator!=((Iterator *)&i_1,&local_c8), bVar2) {
      puVar6 = Range<unsigned_int>::Iterator::operator*((Iterator *)&i_1);
      uVar1 = *puVar6;
      uVar5 = MaybeUint::operator*(this_01->rows + uVar1);
      if (size <= uVar5) {
        Debug::Fault::Fault(&f_5,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xe2,FAILED,"*leaf.rows[i] < size","");
        Debug::Fault::fatal(&f_5);
      }
      if (uVar1 + 1 < uVar3) {
        uVar5 = MaybeUint::operator*(this_01->rows + uVar1);
        uVar4 = MaybeUint::operator*(this_01->rows + (uVar1 + 1));
        bVar2 = FunctionParam<bool_(unsigned_int,_unsigned_int)>::operator()(f,uVar5,uVar4);
        if (!bVar2) {
          Debug::Fault::Fault(&f_6,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              ,0xe4,FAILED,"f(*leaf.rows[i], *leaf.rows[i + 1])","");
          Debug::Fault::fatal(&f_6);
        }
      }
      else {
        bVar2 = MaybeUint::operator==((MaybeUint *)((long)&this_local + 4),(void *)0x0);
        local_121 = true;
        if (!bVar2) {
          local_121 = MaybeUint::operator==
                                (this_01->rows + (uVar3 - 1),(MaybeUint *)((long)&this_local + 4));
        }
        if (local_121 == false) {
          Debug::Fault::Fault(&local_e8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                              ,0xe6,FAILED,"maxRow == nullptr || leaf.rows[n-1] == maxRow","");
          Debug::Fault::fatal(&local_e8);
        }
      }
      Range<unsigned_int>::Iterator::operator++((Iterator *)&i_1);
    }
    uStack_10 = (ulong)uVar3;
  }
  else {
    this_00 = (Parent *)(this->tree + pos);
    uVar3 = Parent::keyCount(this_00);
    __range3 = (Range<unsigned_int> *)0x0;
    ___end3 = zeroTo<unsigned_int>(uVar3);
    i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
    local_68 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
    while (bVar2 = Range<unsigned_int>::Iterator::operator!=((Iterator *)&i,&local_68), bVar2) {
      puVar6 = Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
      f_1.exception._4_4_ = *puVar6;
      uVar5 = MaybeUint::operator*(this_00->keys + f_1.exception._4_4_);
      if (size <= uVar5) {
        Debug::Fault::Fault(&local_78,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xd7,FAILED,"*parent.keys[i] < size","");
        Debug::Fault::fatal(&local_78);
      }
      f_2.exception._0_4_ = this_00->keys[f_1.exception._4_4_].i;
      sVar7 = verifyNode(this,size,f,this_00->children[f_1.exception._4_4_],height - 1,
                         f_2.exception._0_4_);
      __range3 = (Range<unsigned_int> *)((long)&__range3->begin_ + sVar7);
      local_f1 = true;
      if (f_1.exception._4_4_ + 1 != uVar3) {
        uVar5 = MaybeUint::operator*(this_00->keys + f_1.exception._4_4_);
        uVar4 = MaybeUint::operator*(this_00->keys + (f_1.exception._4_4_ + 1));
        local_f1 = FunctionParam<bool_(unsigned_int,_unsigned_int)>::operator()(f,uVar5,uVar4);
      }
      if (local_f1 == false) {
        Debug::Fault::Fault(&local_90,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                            ,0xd9,FAILED,"i + 1 == n || f(*parent.keys[i], *parent.keys[i + 1])","")
        ;
        Debug::Fault::fatal(&local_90);
      }
      Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
    }
    f_3.exception._4_4_ = this_local._4_4_;
    sVar7 = verifyNode(this,size,f,this_00->children[uVar3],height - 1,this_local._4_4_);
    bVar2 = MaybeUint::operator==((MaybeUint *)((long)&this_local + 4),(void *)0x0);
    local_101 = true;
    if (!bVar2) {
      uVar3 = MaybeUint::operator*(this_00->keys + (uVar3 - 1));
      uVar5 = MaybeUint::operator*((MaybeUint *)((long)&this_local + 4));
      local_101 = FunctionParam<bool_(unsigned_int,_unsigned_int)>::operator()(f,uVar3,uVar5);
    }
    uStack_10 = (long)&__range3->begin_ + sVar7;
    if (local_101 == false) {
      Debug::Fault::Fault((Fault *)&leaf,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                          ,0xdc,FAILED,"maxRow == nullptr || f(*parent.keys[n-1], *maxRow)","");
      Debug::Fault::fatal((Fault *)&leaf);
    }
  }
  return uStack_10;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      KJ_ASSERT(i + 1 == n || f(*parent.keys[i], *parent.keys[i + 1]));
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    KJ_ASSERT(maxRow == nullptr || f(*parent.keys[n-1], *maxRow));
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size);
      if (i + 1 < n) {
        KJ_ASSERT(f(*leaf.rows[i], *leaf.rows[i + 1]));
      } else {
        KJ_ASSERT(maxRow == nullptr || leaf.rows[n-1] == maxRow);
      }
    }
    return n;
  }
}